

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O2

void Abc_FlowRetime_ConstrainConserv(Abc_Ntk_t *pNtk)

{
  Flow_Data_t *pFVar1;
  ushort uVar2;
  void **ppvVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  void *pvVar6;
  Abc_Obj_t *pAVar7;
  long *plVar8;
  uint uVar9;
  MinRegMan_t *pMVar10;
  char *__function;
  uint uVar11;
  uint uVar12;
  Vec_Ptr_t *pVVar13;
  int iVar14;
  char *__assertion;
  long lVar15;
  
  pMVar10 = pManMR;
  pManMR->nExactConstraints = 0;
  while (pMVar10->vExactNodes->nSize != 0) {
    pvVar6 = Vec_PtrPop(pMVar10->vExactNodes);
    pMVar10 = pManMR;
    if (pManMR->vTimeEdges[*(uint *)((long)pvVar6 + 0x10)].nSize != 0) {
      pVVar13 = pManMR->vTimeEdges + *(uint *)((long)pvVar6 + 0x10);
      ppvVar3 = pVVar13->pArray;
      pVVar13->nCap = 0;
      pVVar13->nSize = 0;
      pVVar13->pArray = (void **)0x0;
      free(ppvVar3);
      pMVar10 = pManMR;
    }
  }
  pVVar13 = pMVar10->vNodes;
  if (pMVar10->fIsForward == 0) {
    if (pVVar13->nSize != 0) {
      __assert_fail("!Vec_PtrSize(vNodes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                    ,0x105,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
    }
    pMVar10->nConservConstraints = 0;
    Abc_NtkIncrementTravId(pNtk);
    for (iVar14 = 0; iVar14 < pNtk->vPos->nSize; iVar14 = iVar14 + 1) {
      pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPos,iVar14);
      Abc_FlowRetime_Dfs_back(pAVar7,pVVar13);
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      plVar8 = (long *)Vec_PtrEntry(pVVar13,iVar14);
      *(uint *)((long)plVar8 + 0x14) = *(uint *)((long)plVar8 + 0x14) & 0xfff;
      for (lVar15 = 0; lVar15 < *(int *)((long)plVar8 + 0x2c); lVar15 = lVar15 + 1) {
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                  (long)*(int *)(plVar8[6] + lVar15 * 4) * 8);
        uVar12 = *(uint *)&pAVar7->field_0x14;
        uVar9 = *(uint *)((long)plVar8 + 0x14);
        iVar5 = Abc_NodeIsTravIdCurrent(pAVar7);
        if (iVar5 != 0) {
          uVar12 = (uint)((uVar9 & 0xf) == 7) + (uVar12 >> 0xc);
          if (*(uint *)((long)plVar8 + 0x14) >> 0xc < uVar12) {
            *(uint *)((long)plVar8 + 0x14) =
                 *(uint *)((long)plVar8 + 0x14) & 0xfff | uVar12 * 0x1000;
          }
        }
      }
      uVar12 = *(uint *)((long)plVar8 + 0x14);
      if ((uVar12 & 0xf) == 5) {
        uVar12 = uVar12 | 0x10;
        *(uint *)((long)plVar8 + 0x14) = uVar12;
      }
      if (pManMR->maxDelay < (int)(uVar12 >> 0xc)) {
        __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                      ,0x11e,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
      }
    }
    pVVar13->nSize = 0;
    Abc_NtkIncrementTravId(pNtk);
    for (iVar14 = 0; iVar14 < pNtk->vBoxes->nSize; iVar14 = iVar14 + 1) {
      pAVar7 = Abc_NtkBox(pNtk,iVar14);
      if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
        ppvVar3 = pAVar7->pNtk->vObjs->pArray;
        pvVar6 = ppvVar3[*(pAVar7->vFanouts).pArray];
        pAVar4 = (Abc_Obj_t *)ppvVar3[*(pAVar7->vFanins).pArray];
        Abc_NodeSetTravIdCurrent(pAVar7);
        Abc_FlowRetime_Dfs_back(pAVar4,pVVar13);
        uVar12 = *(uint *)((long)pvVar6 + 0x14);
        if ((uVar12 & 0x10) == 0) {
          *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfff;
        }
        else {
          *(uint *)((long)pvVar6 + 0x14) = uVar12 & 0xffffffef;
          *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfff | uVar12 & 0xfffff000;
          if (pManMR->maxDelay < (int)(uVar12 >> 0xc)) {
            __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                          ,0x12f,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
          }
        }
      }
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      plVar8 = (long *)Vec_PtrEntry(pVVar13,iVar14);
      *(byte *)((long)plVar8 + 0x14) = *(byte *)((long)plVar8 + 0x14) | 0x20;
      for (lVar15 = 0; lVar15 < *(int *)((long)plVar8 + 0x2c); lVar15 = lVar15 + 1) {
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                  (long)*(int *)(plVar8[6] + lVar15 * 4) * 8);
        iVar5 = Abc_NodeIsTravIdCurrent(pAVar7);
        if ((iVar5 != 0) &&
           (uVar12 = *(uint *)&pAVar7->field_0x14,
           (char)((uVar12 & 0x20) >> 5) == '\0' && (uVar12 & 0xf) != 8)) {
          __assert_fail("pNext->fMarkB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                        ,0x13b,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
        }
      }
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      pvVar6 = Vec_PtrEntry(pVVar13,iVar14);
      *(byte *)((long)pvVar6 + 0x14) = *(byte *)((long)pvVar6 + 0x14) & 0xdf;
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      plVar8 = (long *)Vec_PtrEntry(pVVar13,iVar14);
      *(uint *)((long)plVar8 + 0x14) = *(uint *)((long)plVar8 + 0x14) & 0xfff;
      for (lVar15 = 0; lVar15 < *(int *)((long)plVar8 + 0x2c); lVar15 = lVar15 + 1) {
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                  (long)*(int *)(plVar8[6] + lVar15 * 4) * 8);
        uVar12 = *(uint *)&pAVar7->field_0x14;
        uVar9 = *(uint *)((long)plVar8 + 0x14);
        iVar5 = Abc_NodeIsTravIdCurrent(pAVar7);
        if (iVar5 != 0) {
          uVar12 = (uint)((uVar9 & 0xf) == 7) + (uVar12 >> 0xc);
          if (*(uint *)((long)plVar8 + 0x14) >> 0xc < uVar12) {
            *(uint *)((long)plVar8 + 0x14) =
                 *(uint *)((long)plVar8 + 0x14) & 0xfff | uVar12 * 0x1000;
          }
        }
      }
      if (pManMR->maxDelay <
          (int)((uint)((*(uint *)((long)plVar8 + 0x14) & 0xf) == 7) +
               (*(uint *)((long)plVar8 + 0x14) >> 0xc))) {
        *(ushort *)(pManMR->pDataArray + *(uint *)(plVar8 + 2)) =
             *(ushort *)(pManMR->pDataArray + *(uint *)(plVar8 + 2)) | 0x10;
      }
    }
    for (iVar14 = 0; iVar14 < pNtk->vBoxes->nSize; iVar14 = iVar14 + 1) {
      pAVar7 = Abc_NtkBox(pNtk,iVar14);
      if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
        *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xff8;
      }
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      plVar8 = (long *)Vec_PtrEntry(pVVar13,iVar14);
      *(uint *)((long)plVar8 + 0x14) = *(uint *)((long)plVar8 + 0x14) & 0xfff;
      for (lVar15 = 0; lVar15 < *(int *)((long)plVar8 + 0x2c); lVar15 = lVar15 + 1) {
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                  (long)*(int *)(plVar8[6] + lVar15 * 4) * 8);
        uVar12 = *(uint *)&pAVar7->field_0x14;
        uVar9 = *(uint *)((long)plVar8 + 0x14);
        iVar5 = Abc_NodeIsTravIdCurrent(pAVar7);
        if (iVar5 != 0) {
          uVar12 = (uint)((uVar9 & 0xf) == 7) + (uVar12 >> 0xc);
          if (*(uint *)((long)plVar8 + 0x14) >> 0xc < uVar12) {
            *(uint *)((long)plVar8 + 0x14) =
                 *(uint *)((long)plVar8 + 0x14) & 0xfff | uVar12 * 0x1000;
          }
        }
      }
      uVar12 = *(uint *)((long)plVar8 + 0x14);
      if ((uVar12 & 0xf) == 5) {
        uVar12 = uVar12 | 0x10;
        *(uint *)((long)plVar8 + 0x14) = uVar12;
      }
      if (pManMR->maxDelay < (int)(uVar12 >> 0xc)) {
        __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                      ,0x166,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
      }
    }
    for (iVar14 = 0; iVar14 < pNtk->vBoxes->nSize; iVar14 = iVar14 + 1) {
      pAVar7 = Abc_NtkBox(pNtk,iVar14);
      if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
        ppvVar3 = pAVar7->pNtk->vObjs->pArray;
        pvVar6 = ppvVar3[*(pAVar7->vFanouts).pArray];
        uVar12 = *(uint *)((long)pvVar6 + 0x14);
        if ((uVar12 & 0xf) != 5) {
          __assert_fail("Abc_ObjIsBo(pBo)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                        ,0x16b,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
        }
        if ((*(uint *)((long)ppvVar3[*(pAVar7->vFanins).pArray] + 0x14) & 0xf) != 4) {
          __assert_fail("Abc_ObjIsBi(pBi)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                        ,0x16d,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
        }
        if ((uVar12 & 0x10) == 0) {
          uVar12 = *(uint *)&pAVar7->field_0x14 & 0xff8;
        }
        else {
          *(uint *)((long)pvVar6 + 0x14) = uVar12 & 0xffffffe5;
          uVar12 = *(uint *)&pAVar7->field_0x14 & 0xfff | uVar12 & 0xfffff000;
        }
        *(uint *)&pAVar7->field_0x14 = uVar12;
      }
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      plVar8 = (long *)Vec_PtrEntry(pVVar13,iVar14);
      *(uint *)((long)plVar8 + 0x14) = *(uint *)((long)plVar8 + 0x14) & 0xfff;
      for (lVar15 = 0; lVar15 < *(int *)((long)plVar8 + 0x2c); lVar15 = lVar15 + 1) {
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                  (long)*(int *)(plVar8[6] + lVar15 * 4) * 8);
        uVar12 = *(uint *)&pAVar7->field_0x14;
        uVar9 = *(uint *)((long)plVar8 + 0x14);
        iVar5 = Abc_NodeIsTravIdCurrent(pAVar7);
        if (iVar5 != 0) {
          uVar12 = (uint)((uVar9 & 0xf) == 7) + (uVar12 >> 0xc);
          if (*(uint *)((long)plVar8 + 0x14) >> 0xc < uVar12) {
            *(uint *)((long)plVar8 + 0x14) =
                 *(uint *)((long)plVar8 + 0x14) & 0xfff | uVar12 * 0x1000;
          }
        }
      }
      pFVar1 = pManMR->pDataArray + *(uint *)(plVar8 + 2);
      uVar2 = *(ushort *)(pManMR->pDataArray + *(uint *)(plVar8 + 2));
      if (pManMR->maxDelay < (int)(*(uint *)((long)plVar8 + 0x14) >> 0xc)) {
        *(ushort *)pFVar1 = uVar2 | 0x80;
        pManMR->nConservConstraints = pManMR->nConservConstraints + 1;
      }
      else {
        *(ushort *)pFVar1 = uVar2 & 0xff7f;
      }
    }
  }
  else {
    if (pVVar13->nSize != 0) {
      __assertion = "!Vec_PtrSize( vNodes )";
      __function = "void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)";
      uVar12 = 0x7c;
      goto LAB_0041400f;
    }
    pMVar10->nConservConstraints = 0;
    Abc_NtkIncrementTravId(pNtk);
    for (iVar14 = 0; iVar14 < pNtk->vPis->nSize; iVar14 = iVar14 + 1) {
      pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPis,iVar14);
      Abc_FlowRetime_Dfs_forw(pAVar7,pVVar13);
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      plVar8 = (long *)Vec_PtrEntry(pVVar13,iVar14);
      *(uint *)((long)plVar8 + 0x14) = *(uint *)((long)plVar8 + 0x14) & 0xfff;
      for (lVar15 = 0; lVar15 < *(int *)((long)plVar8 + 0x1c); lVar15 = lVar15 + 1) {
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                  (long)*(int *)(plVar8[4] + lVar15 * 4) * 8);
        iVar5 = Abc_NodeIsTravIdCurrent(pAVar7);
        if (iVar5 != 0) {
          uVar12 = *(uint *)&pAVar7->field_0x14;
          if (*(uint *)((long)plVar8 + 0x14) >> 0xc < uVar12 >> 0xc) {
            *(uint *)((long)plVar8 + 0x14) =
                 *(uint *)((long)plVar8 + 0x14) & 0xfff | uVar12 & 0xfffff000;
          }
        }
      }
      uVar9 = *(uint *)((long)plVar8 + 0x14) & 0xf;
      uVar11 = (uint)(uVar9 == 7) * 0x1000 + *(uint *)((long)plVar8 + 0x14);
      uVar12 = uVar11 | 0x10;
      if (uVar9 != 4) {
        uVar12 = uVar11;
      }
      *(uint *)((long)plVar8 + 0x14) = uVar12;
      if (pManMR->maxDelay < (int)(uVar12 >> 0xc)) {
        __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                      ,0x94,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
      }
    }
    pVVar13->nSize = 0;
    Abc_NtkIncrementTravId(pNtk);
    for (iVar14 = 0; iVar14 < pNtk->vBoxes->nSize; iVar14 = iVar14 + 1) {
      pAVar7 = Abc_NtkBox(pNtk,iVar14);
      if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
        ppvVar3 = pAVar7->pNtk->vObjs->pArray;
        pAVar4 = (Abc_Obj_t *)ppvVar3[*(pAVar7->vFanouts).pArray];
        pvVar6 = ppvVar3[*(pAVar7->vFanins).pArray];
        Abc_NodeSetTravIdCurrent(pAVar7);
        Abc_FlowRetime_Dfs_forw(pAVar4,pVVar13);
        uVar12 = *(uint *)((long)pvVar6 + 0x14);
        if ((uVar12 & 0x10) == 0) {
          *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfff;
        }
        else {
          *(uint *)((long)pvVar6 + 0x14) = uVar12 & 0xffffffef;
          *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfff | uVar12 & 0xfffff000;
          if (pManMR->maxDelay < (int)(uVar12 >> 0xc)) {
            __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                          ,0xa5,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
          }
        }
      }
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      plVar8 = (long *)Vec_PtrEntry(pVVar13,iVar14);
      *(byte *)((long)plVar8 + 0x14) = *(byte *)((long)plVar8 + 0x14) | 0x20;
      for (lVar15 = 0; lVar15 < *(int *)((long)plVar8 + 0x1c); lVar15 = lVar15 + 1) {
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                  (long)*(int *)(plVar8[4] + lVar15 * 4) * 8);
        iVar5 = Abc_NodeIsTravIdCurrent(pAVar7);
        if ((iVar5 != 0) &&
           (uVar12 = *(uint *)&pAVar7->field_0x14,
           (char)((uVar12 & 0x20) >> 5) == '\0' && (uVar12 & 0xf) != 8)) {
          __assert_fail("pNext->fMarkB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                        ,0xb1,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
        }
      }
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      pvVar6 = Vec_PtrEntry(pVVar13,iVar14);
      *(byte *)((long)pvVar6 + 0x14) = *(byte *)((long)pvVar6 + 0x14) & 0xdf;
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      plVar8 = (long *)Vec_PtrEntry(pVVar13,iVar14);
      *(uint *)((long)plVar8 + 0x14) = *(uint *)((long)plVar8 + 0x14) & 0xfff;
      for (lVar15 = 0; lVar15 < *(int *)((long)plVar8 + 0x1c); lVar15 = lVar15 + 1) {
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                  (long)*(int *)(plVar8[4] + lVar15 * 4) * 8);
        iVar5 = Abc_NodeIsTravIdCurrent(pAVar7);
        if (iVar5 != 0) {
          uVar12 = *(uint *)&pAVar7->field_0x14;
          if (*(uint *)((long)plVar8 + 0x14) >> 0xc < uVar12 >> 0xc) {
            *(uint *)((long)plVar8 + 0x14) =
                 *(uint *)((long)plVar8 + 0x14) & 0xfff | uVar12 & 0xfffff000;
          }
        }
      }
      uVar12 = (uint)((*(uint *)((long)plVar8 + 0x14) & 0xf) == 7) * 0x1000 +
               *(uint *)((long)plVar8 + 0x14);
      *(uint *)((long)plVar8 + 0x14) = uVar12;
      if (pManMR->maxDelay < (int)(uVar12 >> 0xc)) {
        *(ushort *)(pManMR->pDataArray + *(uint *)(plVar8 + 2)) =
             *(ushort *)(pManMR->pDataArray + *(uint *)(plVar8 + 2)) | 0x10;
      }
    }
    for (iVar14 = 0; iVar14 < pNtk->vBoxes->nSize; iVar14 = iVar14 + 1) {
      pAVar7 = Abc_NtkBox(pNtk,iVar14);
      if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
        *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xff8;
      }
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      plVar8 = (long *)Vec_PtrEntry(pVVar13,iVar14);
      *(uint *)((long)plVar8 + 0x14) = *(uint *)((long)plVar8 + 0x14) & 0xfff;
      for (lVar15 = 0; lVar15 < *(int *)((long)plVar8 + 0x1c); lVar15 = lVar15 + 1) {
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                  (long)*(int *)(plVar8[4] + lVar15 * 4) * 8);
        iVar5 = Abc_NodeIsTravIdCurrent(pAVar7);
        if (iVar5 != 0) {
          uVar12 = *(uint *)&pAVar7->field_0x14;
          if (*(uint *)((long)plVar8 + 0x14) >> 0xc < uVar12 >> 0xc) {
            *(uint *)((long)plVar8 + 0x14) =
                 *(uint *)((long)plVar8 + 0x14) & 0xfff | uVar12 & 0xfffff000;
          }
        }
      }
      uVar9 = *(uint *)((long)plVar8 + 0x14) & 0xf;
      uVar11 = (uint)(uVar9 == 7) * 0x1000 + *(uint *)((long)plVar8 + 0x14);
      uVar12 = uVar11 | 0x10;
      if (uVar9 != 4) {
        uVar12 = uVar11;
      }
      *(uint *)((long)plVar8 + 0x14) = uVar12;
      if (pManMR->maxDelay < (int)(uVar12 >> 0xc)) {
        __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                      ,0xdb,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
      }
    }
    for (iVar14 = 0; iVar14 < pNtk->vBoxes->nSize; iVar14 = iVar14 + 1) {
      pAVar7 = Abc_NtkBox(pNtk,iVar14);
      if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
        pvVar6 = pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
        uVar12 = *(uint *)((long)pvVar6 + 0x14);
        if ((uVar12 & 0x10) == 0) {
          *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xff8;
        }
        else {
          *(uint *)((long)pvVar6 + 0x14) = uVar12 & 0xffffffef;
          *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfff | uVar12 & 0xfffff000;
          if (pManMR->maxDelay < (int)(uVar12 >> 0xc)) {
            __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                          ,0xe5,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
          }
        }
      }
    }
    iVar14 = pVVar13->nSize;
    while (0 < iVar14) {
      iVar14 = iVar14 + -1;
      plVar8 = (long *)Vec_PtrEntry(pVVar13,iVar14);
      *(uint *)((long)plVar8 + 0x14) = *(uint *)((long)plVar8 + 0x14) & 0xfff;
      for (lVar15 = 0; lVar15 < *(int *)((long)plVar8 + 0x1c); lVar15 = lVar15 + 1) {
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                  (long)*(int *)(plVar8[4] + lVar15 * 4) * 8);
        iVar5 = Abc_NodeIsTravIdCurrent(pAVar7);
        if (iVar5 != 0) {
          uVar12 = *(uint *)&pAVar7->field_0x14;
          if (*(uint *)((long)plVar8 + 0x14) >> 0xc < uVar12 >> 0xc) {
            *(uint *)((long)plVar8 + 0x14) =
                 *(uint *)((long)plVar8 + 0x14) & 0xfff | uVar12 & 0xfffff000;
          }
        }
      }
      uVar12 = (uint)((*(uint *)((long)plVar8 + 0x14) & 0xf) == 7) * 0x1000 +
               *(uint *)((long)plVar8 + 0x14);
      *(uint *)((long)plVar8 + 0x14) = uVar12;
      pFVar1 = pManMR->pDataArray + *(uint *)(plVar8 + 2);
      uVar2 = *(ushort *)(pManMR->pDataArray + *(uint *)(plVar8 + 2));
      if (pManMR->maxDelay < (int)(uVar12 >> 0xc)) {
        *(ushort *)pFVar1 = uVar2 | 0x80;
        pManMR->nConservConstraints = pManMR->nConservConstraints + 1;
      }
      else {
        *(ushort *)pFVar1 = uVar2 & 0xff7f;
      }
    }
  }
  pVVar13->nSize = 0;
  iVar14 = 0;
  while( true ) {
    if (pNtk->vObjs->nSize <= iVar14) {
      return;
    }
    pAVar7 = Abc_NtkObj(pNtk,iVar14);
    if ((pAVar7 != (Abc_Obj_t *)0x0) && (pManMR->vTimeEdges[(uint)pAVar7->Id].nSize != 0)) break;
    iVar14 = iVar14 + 1;
  }
  __assertion = "!Vec_PtrSize(FTIMEEDGES(pObj))";
  __function = "void Abc_FlowRetime_ConstrainConserv(Abc_Ntk_t *)";
  uVar12 = 0x73;
LAB_0041400f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                ,uVar12,__function);
}

Assistant:

void Abc_FlowRetime_ConstrainConserv( Abc_Ntk_t * pNtk ) {  
  Abc_Obj_t *pObj;
  int i;
  void *pArray;

  // clear all exact constraints
  pManMR->nExactConstraints = 0;
  while( Vec_PtrSize( pManMR->vExactNodes )) {
    pObj = (Abc_Obj_t*)Vec_PtrPop( pManMR->vExactNodes );
    
    if ( Vec_PtrSize( FTIMEEDGES(pObj) )) {
      pArray =  Vec_PtrReleaseArray( FTIMEEDGES(pObj) );
      ABC_FREE( pArray );
    }
  }

#if !defined(IGNORE_TIMING)
  if (pManMR->fIsForward) {
    Abc_FlowRetime_ConstrainConserv_forw(pNtk);
  } else {
    Abc_FlowRetime_ConstrainConserv_back(pNtk);
  }
#endif

  Abc_NtkForEachObj( pNtk, pObj, i)
    assert( !Vec_PtrSize(FTIMEEDGES(pObj)) );
}